

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_execution_limitations.cpp
# Opt level: O1

spv_result_t spvtools::val::ValidateExecutionLimitations(ValidationState_t *_,Instruction *inst)

{
  ValidationState_t *this;
  Instruction *pIVar1;
  ulong uVar2;
  _Rb_tree_node_base *p_Var3;
  ulong uVar4;
  bool bVar5;
  Function *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  Function *entry_point;
  ulong uVar10;
  spv_result_t sVar11;
  uint *puVar12;
  bool bVar13;
  string reason;
  spv_result_t local_2a4;
  string local_2a0;
  ValidationState_t *local_280;
  Instruction *local_278;
  ulong local_270;
  string local_268;
  string local_248;
  uint *local_228;
  uint *local_220;
  Function *local_218;
  _Rb_tree_node_base *local_210;
  DiagnosticStream local_208;
  
  sVar11 = SPV_SUCCESS;
  if ((inst->inst_).opcode == 0x36) {
    this_00 = ValidationState_t::function(_,(inst->inst_).result_id);
    if (this_00 == (Function *)0x0) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INTERNAL,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"Internal error: missing function id ",0x24);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,".",1);
      DiagnosticStream::~DiagnosticStream(&local_208);
      sVar11 = local_208.error_;
    }
    else {
      pvVar6 = ValidationState_t::FunctionEntryPoints(_,(inst->inst_).result_id);
      puVar12 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_228 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      sVar11 = SPV_SUCCESS;
      local_280 = _;
      local_278 = inst;
      local_218 = this_00;
      if (puVar12 != local_228) {
        do {
          uVar10 = (ulong)*puVar12;
          psVar7 = ValidationState_t::GetExecutionModels(_,*puVar12);
          local_220 = puVar12;
          if (psVar7 == (set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                         *)0x0) {
LAB_00183496:
            local_2a0._M_string_length = 0;
            local_2a0.field_2._M_local_buf[0] = '\0';
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
            entry_point = ValidationState_t::function(_,(uint32_t)uVar10);
            bVar13 = Function::CheckLimitations(this_00,_,entry_point,&local_2a0);
            if (!bVar13) {
              local_270 = uVar10;
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"OpEntryPoint Entry Point <id> ",0x1e);
              ValidationState_t::getIdName_abi_cxx11_(&local_248,_,(uint32_t)local_270);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_248._M_dataplus._M_p,local_248._M_string_length
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"s callgraph contains function <id> ",0x23);
              ValidationState_t::getIdName_abi_cxx11_(&local_268,_,(inst->inst_).result_id);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_268._M_dataplus._M_p,local_268._M_string_length
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         ", which cannot be used with the current execution modes:\n",0x39);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_2a0._M_dataplus._M_p,local_2a0._M_string_length
                        );
              local_2a4 = local_208.error_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._M_dataplus._M_p != &local_268.field_2) {
                operator_delete(local_268._M_dataplus._M_p,
                                local_268.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              DiagnosticStream::~DiagnosticStream(&local_208);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p,
                              CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                       local_2a0.field_2._M_local_buf[0]) + 1);
            }
          }
          else if ((psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INTERNAL,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,
                       "Internal error: empty execution models for function id ",0x37);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,".",1);
            local_2a4 = local_208.error_;
            DiagnosticStream::~DiagnosticStream(&local_208);
            bVar13 = false;
          }
          else {
            p_Var9 = (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var8 = &(psVar7->_M_t)._M_impl.super__Rb_tree_header._M_header;
            bVar13 = p_Var9 == p_Var8;
            uVar4 = uVar10;
            uVar2 = local_270;
            p_Var3 = local_210;
            while (local_270 = uVar4, local_210 = p_Var8, !bVar13) {
              local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
              local_2a0._M_string_length = 0;
              local_2a0.field_2._M_local_buf[0] = '\0';
              bVar5 = Function::IsCompatibleWithExecutionModel
                                (this_00,p_Var9[1]._M_color,&local_2a0);
              pIVar1 = local_278;
              this = local_280;
              if (!bVar5) {
                ValidationState_t::diag(&local_208,local_280,SPV_ERROR_INVALID_ID,local_278);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"OpEntryPoint Entry Point <id> ",0x1e);
                ValidationState_t::getIdName_abi_cxx11_(&local_248,this,(uint32_t)uVar10);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_248._M_dataplus._M_p,
                           local_248._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"s callgraph contains function <id> ",0x23);
                ValidationState_t::getIdName_abi_cxx11_(&local_268,this,(pIVar1->inst_).result_id);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_268._M_dataplus._M_p,
                           local_268._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,
                           ", which cannot be used with the current execution model:\n",0x39);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_2a0._M_dataplus._M_p,
                           local_2a0._M_string_length);
                local_2a4 = local_208.error_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_dataplus._M_p != &local_268.field_2) {
                  operator_delete(local_268._M_dataplus._M_p,
                                  local_268.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) {
                  operator_delete(local_248._M_dataplus._M_p,
                                  local_248.field_2._M_allocated_capacity + 1);
                }
                DiagnosticStream::~DiagnosticStream(&local_208);
                uVar10 = local_270;
                this_00 = local_218;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p,
                                CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                         local_2a0.field_2._M_local_buf[0]) + 1);
              }
              uVar2 = local_270;
              p_Var3 = local_210;
              if (!bVar5) break;
              p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
              p_Var8 = local_210;
              uVar4 = local_270;
              uVar2 = local_270;
              p_Var3 = local_210;
              bVar13 = p_Var9 == local_210;
            }
            local_210 = p_Var3;
            local_270 = uVar2;
            _ = local_280;
            inst = local_278;
            if (bVar13) goto LAB_00183496;
            bVar13 = false;
          }
          if (bVar13 == false) {
            return local_2a4;
          }
          puVar12 = local_220 + 1;
        } while (puVar12 != local_228);
        sVar11 = SPV_SUCCESS;
      }
    }
  }
  return sVar11;
}

Assistant:

spv_result_t ValidateExecutionLimitations(ValidationState_t& _,
                                          const Instruction* inst) {
  if (inst->opcode() != spv::Op::OpFunction) {
    return SPV_SUCCESS;
  }

  const auto func = _.function(inst->id());
  if (!func) {
    return _.diag(SPV_ERROR_INTERNAL, inst)
           << "Internal error: missing function id " << inst->id() << ".";
  }

  for (uint32_t entry_id : _.FunctionEntryPoints(inst->id())) {
    const auto* models = _.GetExecutionModels(entry_id);
    if (models) {
      if (models->empty()) {
        return _.diag(SPV_ERROR_INTERNAL, inst)
               << "Internal error: empty execution models for function id "
               << entry_id << ".";
      }
      for (const auto model : *models) {
        std::string reason;
        if (!func->IsCompatibleWithExecutionModel(model, &reason)) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "OpEntryPoint Entry Point <id> " << _.getIdName(entry_id)
                 << "s callgraph contains function <id> "
                 << _.getIdName(inst->id())
                 << ", which cannot be used with the current execution "
                    "model:\n"
                 << reason;
        }
      }
    }

    std::string reason;
    if (!func->CheckLimitations(_, _.function(entry_id), &reason)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "OpEntryPoint Entry Point <id> " << _.getIdName(entry_id)
             << "s callgraph contains function <id> " << _.getIdName(inst->id())
             << ", which cannot be used with the current execution "
                "modes:\n"
             << reason;
    }
  }
  return SPV_SUCCESS;
}